

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

iterator * __thiscall
ft::deque<int,_ft::allocator<int>_>::erase
          (iterator *__return_storage_ptr__,deque<int,_ft::allocator<int>_> *this,iterator *first,
          iterator *last)

{
  bool bVar1;
  reference val;
  iterator local_178;
  undefined1 local_150 [8];
  iterator it;
  allocator<int> local_fd [13];
  iterator local_f0;
  dequeIterator<int,_64UL> local_c8;
  undefined1 local_a0 [8];
  deque<int,_ft::allocator<int>_> tmp;
  iterator *last_local;
  iterator *first_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  tmp._112_8_ = last;
  dequeIterator<int,_64UL>::dequeIterator(&local_c8,last);
  end(&local_f0,this);
  allocator<int>::allocator(local_fd);
  deque<int,ft::allocator<int>>::deque<ft::dequeIterator<int,64ul>>
            ((deque<int,ft::allocator<int>> *)local_a0,&local_c8,&local_f0,local_fd,(type *)0x0);
  allocator<int>::~allocator(local_fd);
  dequeIterator<int,_64UL>::~dequeIterator(&local_f0);
  dequeIterator<int,_64UL>::~dequeIterator(&local_c8);
  while( true ) {
    end((iterator *)&it.m_node,this);
    bVar1 = operator!=(first,(dequeIterator<int,_64UL> *)&it.m_node);
    dequeIterator<int,_64UL>::~dequeIterator((dequeIterator<int,_64UL> *)&it.m_node);
    if (!bVar1) break;
    pop_back(this);
  }
  begin((iterator *)local_150,(deque<int,_ft::allocator<int>_> *)local_a0);
  while( true ) {
    end(&local_178,(deque<int,_ft::allocator<int>_> *)local_a0);
    bVar1 = operator!=((dequeIterator<int,_64UL> *)local_150,&local_178);
    dequeIterator<int,_64UL>::~dequeIterator(&local_178);
    if (!bVar1) break;
    val = dequeIterator<int,_64UL>::operator*((dequeIterator<int,_64UL> *)local_150);
    push_back(this,val);
    dequeIterator<int,_64UL>::operator++((dequeIterator<int,_64UL> *)local_150);
  }
  dequeIterator<int,_64UL>::~dequeIterator((dequeIterator<int,_64UL> *)local_150);
  dequeIterator<int,_64UL>::dequeIterator(__return_storage_ptr__,first);
  ~deque((deque<int,_ft::allocator<int>_> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

iterator	erase(iterator first, iterator last) {
		deque	tmp(last, this->end());
		while (first != this->end())
			this->pop_back();
		for (iterator it = tmp.begin(); it != tmp.end(); ++it)
			this->push_back(*it);
		return first;
	}